

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::AlterBinder::BindColumnReference
          (BindResult *__return_storage_ptr__,AlterBinder *this,ColumnRefExpression *col_ref,
          idx_t depth)

{
  TableCatalogEntry *this_00;
  bool bVar1;
  BaseExpression *this_01;
  LambdaRefExpression *expr;
  reference pvVar2;
  ColumnDefinition *pCVar3;
  LogicalType *args;
  BinderException *pBVar4;
  pointer *__ptr;
  _Alloc_hider _Var5;
  LogicalIndex idx;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Alloc_hider local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = ColumnRefExpression::IsQualified(col_ref);
  if (!bVar1) {
    (*(col_ref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_70,col_ref);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)&idx,&(this->super_ExpressionBinder).lambda_bindings,&local_70
              );
    ::std::__cxx11::string::~string((string *)&local_70);
    if (idx.index != 0) {
      this_01 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&idx)->super_BaseExpression;
      expr = BaseExpression::Cast<duckdb::LambdaRefExpression>(this_01);
      BindLambdaReference(__return_storage_ptr__,this,expr,depth);
      _Var5._M_p = (pointer)idx;
      goto LAB_0060d920;
    }
  }
  if (0x20 < (ulong)((long)(col_ref->column_names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(col_ref->column_names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    ExpressionBinder::BindQualifiedColumnName
              (__return_storage_ptr__,&this->super_ExpressionBinder,col_ref,
               &(this->table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
    return __return_storage_ptr__;
  }
  this_00 = this->table;
  pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&col_ref->column_names,0);
  idx = TableCatalogEntry::GetColumnIndex(this_00,pvVar2,true);
  if (idx.index == 0xffffffffffffffff) {
    pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_70,"Table does not contain column %s referenced in alter statement!"
               ,(allocator *)&local_78);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&col_ref->column_names,0);
    ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar2);
    BinderException::BinderException<std::__cxx11::string>(pBVar4,&local_70,&local_50);
    __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar3 = TableCatalogEntry::GetColumn(this->table,idx);
  bVar1 = ColumnDefinition::Generated(pCVar3);
  if (bVar1) {
    pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_70,"Using generated columns in alter statement not supported",
               (allocator *)&local_78);
    BinderException::BinderException(pBVar4,&local_70);
    __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::push_back
            (&this->bound_columns->
              super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,&idx);
  pCVar3 = TableCatalogEntry::GetColumn(this->table,idx);
  args = ColumnDefinition::Type(pCVar3);
  local_78._M_p =
       (pointer)(((long)(this->bound_columns->
                        super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
                        super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->bound_columns->
                        super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
                        super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + -1);
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long>
            ((duckdb *)&local_70,args,(unsigned_long *)&local_78);
  local_80._M_head_impl = (Expression *)local_70._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)0x0;
  BindResult::BindResult
            (__return_storage_ptr__,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_80);
  if (local_80._M_head_impl != (Expression *)0x0) {
    (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_80._M_head_impl = (Expression *)0x0;
  _Var5._M_p = local_70._M_dataplus._M_p;
LAB_0060d920:
  if ((long *)_Var5._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var5._M_p + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult AlterBinder::BindColumnReference(ColumnRefExpression &col_ref, idx_t depth) {

	// try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
	}

	if (col_ref.column_names.size() > 1) {
		return BindQualifiedColumnName(col_ref, table.name);
	}

	auto idx = table.GetColumnIndex(col_ref.column_names[0], true);
	if (!idx.IsValid()) {
		throw BinderException("Table does not contain column %s referenced in alter statement!",
		                      col_ref.column_names[0]);
	}
	if (table.GetColumn(idx).Generated()) {
		throw BinderException("Using generated columns in alter statement not supported");
	}
	bound_columns.push_back(idx);
	return BindResult(make_uniq<BoundReferenceExpression>(table.GetColumn(idx).Type(), bound_columns.size() - 1));
}